

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O1

void __thiscall icu_63::TZGNCore::cleanup(TZGNCore *this,EVP_PKEY_CTX *ctx)

{
  if (this->fLocaleDisplayNames != (LocaleDisplayNames *)0x0) {
    (*(this->fLocaleDisplayNames->super_UObject)._vptr_UObject[1])();
  }
  if (this->fTimeZoneNames != (TimeZoneNames *)0x0) {
    (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[1])();
  }
  uhash_close_63(this->fLocationNamesMap);
  uhash_close_63(this->fPartialLocationNamesMap);
  return;
}

Assistant:

void
TZGNCore::cleanup() {
    if (fLocaleDisplayNames != NULL) {
        delete fLocaleDisplayNames;
    }
    if (fTimeZoneNames != NULL) {
        delete fTimeZoneNames;
    }

    uhash_close(fLocationNamesMap);
    uhash_close(fPartialLocationNamesMap);
}